

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlm_gp.cpp
# Opt level: O0

tlm_extension_registry * tlm::anon_unknown_2::tlm_extension_registry::instance(void)

{
  tlm_extension_registry *ptVar1;
  
  if ((anonymous_namespace)::tlm_extension_registry::instance_ == (tlm_extension_registry *)0x0) {
    ptVar1 = (tlm_extension_registry *)operator_new(0x30);
    tlm_extension_registry((tlm_extension_registry *)0x2f50c7);
    (anonymous_namespace)::tlm_extension_registry::instance_ = ptVar1;
  }
  return (anonymous_namespace)::tlm_extension_registry::instance_;
}

Assistant:

static tlm_extension_registry& instance()
    {
        if (!instance_) // don't cleanup registry
            instance_ = new tlm_extension_registry();
        return *instance_;
    }